

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

int Abc_TtReadHex(word *pTruth,char *pString)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  word wVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  if (*pString == '0') {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
  }
  if ((0xf5 < (byte)(*pString - 0x3aU)) || (uVar9 = 0, 0xf9 < (byte)((*pString & 0xdfU) + 0xb9))) {
    uVar9 = 0;
    do {
      do {
        lVar3 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while (0xf5 < (byte)(((byte *)pString)[lVar3] - 0x3a));
    } while (0xf9 < (byte)((((byte *)pString)[lVar3] & 0xdf) + 0xb9));
  }
  iVar8 = (int)uVar9;
  iVar10 = iVar8;
  if (iVar8 == 0) {
LAB_00748f1c:
    iVar10 = iVar10 + 2;
LAB_00748f20:
    uVar4 = 1 << ((char)iVar10 - 6U & 0x1f);
    if (iVar10 < 7) {
      uVar4 = 1;
    }
    if (0 < (int)uVar4) {
      memset(pTruth,0,(ulong)uVar4 << 3);
    }
    wVar5 = 0xffffffa9;
    if (iVar8 != 0) {
      uVar6 = 0;
      do {
        bVar1 = ((byte *)pString)[~uVar6 + (long)iVar8];
        iVar7 = -0x30;
        if (((9 < (byte)(bVar1 - 0x30)) && (iVar7 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
           (iVar7 = -0x57, 5 < (byte)(bVar1 + 0x9f))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x4bf,"int Abc_TtReadHexDigit(char)");
        }
        pTruth[uVar6 >> 4 & 0xfffffff] =
             pTruth[uVar6 >> 4 & 0xfffffff] |
             (ulong)(uint)(iVar7 + (char)bVar1) << ((char)uVar6 * '\x04' & 0x3fU);
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uVar9 & 0xffffffff));
    }
    if (5 < iVar10) goto LAB_00749023;
    if (iVar10 < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    uVar4 = (uint)*pTruth & 0xf;
    uVar9 = (ulong)(uVar4 << 4 | uVar4);
    if (iVar10 != 2) {
      uVar9 = *pTruth;
    }
    iVar8 = 3;
    if (iVar10 != 2) {
      iVar8 = iVar10;
    }
    uVar6 = (ulong)(uint)((int)(uVar9 & 0xff) << 8) | uVar9 & 0xff;
    if (iVar8 != 3) {
      uVar6 = uVar9;
    }
    uVar9 = (ulong)((uint)uVar6 << 0x10 | (uint)uVar6 & 0xffff);
    if (1 < iVar8 - 3U) {
      uVar9 = uVar6;
    }
    wVar5 = (uVar9 & 0xffffffff) * 0x100000001;
  }
  else {
    if (iVar8 != 1) {
      uVar4 = iVar8 - 1;
      if (uVar4 == 0) {
        iVar10 = 0;
      }
      else {
        uVar2 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar10 = (uVar2 ^ 0xffffffe0) + 0x21;
      }
      goto LAB_00748f1c;
    }
    bVar1 = *pString;
    iVar10 = 2;
    if (0x40 < bVar1) {
      if (bVar1 == 0x41) {
LAB_00748ef9:
        wVar5 = 0xaaaaaaaaaaaaaaaa;
        if (bVar1 == 0x35) {
          wVar5 = 0x5555555555555555;
        }
        goto LAB_00749020;
      }
      if (bVar1 == 0x46) goto LAB_00748ee9;
      goto LAB_00748f20;
    }
    if (bVar1 != 0x30) {
      if (bVar1 != 0x35) goto LAB_00748f20;
      goto LAB_00748ef9;
    }
LAB_00748ee9:
    wVar5 = -(ulong)(bVar1 != 0x30);
  }
LAB_00749020:
  *pTruth = wVar5;
LAB_00749023:
  return (int)wVar5;
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + (nDigits == 1 ? 0 : Abc_Base2Log(nDigits));
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}